

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t httplib::detail::create_client_socket
                   (char *host,char *ip,int port,int address_family,bool tcp_nodelay,
                   SocketOptions *socket_options,time_t connection_timeout_sec,
                   time_t connection_timeout_usec,time_t read_timeout_sec,time_t read_timeout_usec,
                   time_t write_timeout_sec,time_t write_timeout_usec,string *intf,Error *error)

{
  anon_class_72_9_423fa509 bind_or_connect;
  socket_t sVar1;
  function<void_(int)> local_58;
  SocketOptions *pSStack_30;
  socket_t sock;
  SocketOptions *socket_options_local;
  int local_20;
  int iStack_1c;
  bool tcp_nodelay_local;
  int address_family_local;
  int port_local;
  char *ip_local;
  char *host_local;
  
  pSStack_30 = socket_options;
  socket_options_local._7_1_ = tcp_nodelay;
  local_20 = address_family;
  iStack_1c = port;
  _address_family_local = ip;
  ip_local = host;
  std::function<void_(int)>::function(&local_58,socket_options);
  bind_or_connect.address_family = &local_20;
  bind_or_connect.intf = intf;
  bind_or_connect.error = error;
  bind_or_connect.connection_timeout_sec = &connection_timeout_sec;
  bind_or_connect.connection_timeout_usec = &connection_timeout_usec;
  bind_or_connect.read_timeout_sec = &read_timeout_sec;
  bind_or_connect.read_timeout_usec = &read_timeout_usec;
  bind_or_connect.write_timeout_sec = &write_timeout_sec;
  bind_or_connect.write_timeout_usec = &write_timeout_usec;
  sVar1 = create_socket<httplib::detail::create_client_socket(char_const*,char_const*,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (host,ip,port,address_family,0,tcp_nodelay,&local_58,bind_or_connect);
  std::function<void_(int)>::~function(&local_58);
  if (sVar1 == -1) {
    if (*error == Success) {
      *error = Connection;
    }
  }
  else {
    *error = Success;
  }
  return sVar1;
}

Assistant:

inline socket_t create_client_socket(
    const char *host, const char *ip, int port, int address_family,
    bool tcp_nodelay, SocketOptions socket_options,
    time_t connection_timeout_sec, time_t connection_timeout_usec,
    time_t read_timeout_sec, time_t read_timeout_usec, time_t write_timeout_sec,
    time_t write_timeout_usec, const std::string &intf, Error &error) {
  auto sock = create_socket(
      host, ip, port, address_family, 0, tcp_nodelay, std::move(socket_options),
      [&](socket_t sock2, struct addrinfo &ai) -> bool {
        if (!intf.empty()) {
#ifdef USE_IF2IP
          auto ip = if2ip(address_family, intf);
          if (ip.empty()) { ip = intf; }
          if (!bind_ip_address(sock2, ip.c_str())) {
            error = Error::BindIPAddress;
            return false;
          }
#endif
        }

        set_nonblocking(sock2, true);

        auto ret =
            ::connect(sock2, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen));

        if (ret < 0) {
          if (is_connection_error()) {
            error = Error::Connection;
            return false;
          }
          error = wait_until_socket_is_ready(sock2, connection_timeout_sec,
                                             connection_timeout_usec);
          if (error != Error::Success) { return false; }
        }

        set_nonblocking(sock2, false);

        {
#ifdef _WIN32
          auto timeout = static_cast<uint32_t>(read_timeout_sec * 1000 +
                                               read_timeout_usec / 1000);
          setsockopt(sock2, SOL_SOCKET, SO_RCVTIMEO, (char *)&timeout,
                     sizeof(timeout));
#else
          timeval tv;
          tv.tv_sec = static_cast<long>(read_timeout_sec);
          tv.tv_usec = static_cast<decltype(tv.tv_usec)>(read_timeout_usec);
          setsockopt(sock2, SOL_SOCKET, SO_RCVTIMEO, (char *)&tv, sizeof(tv));
#endif
        }
        {

#ifdef _WIN32
          auto timeout = static_cast<uint32_t>(write_timeout_sec * 1000 +
                                               write_timeout_usec / 1000);
          setsockopt(sock2, SOL_SOCKET, SO_SNDTIMEO, (char *)&timeout,
                     sizeof(timeout));
#else
          timeval tv;
          tv.tv_sec = static_cast<long>(write_timeout_sec);
          tv.tv_usec = static_cast<decltype(tv.tv_usec)>(write_timeout_usec);
          setsockopt(sock2, SOL_SOCKET, SO_SNDTIMEO, (char *)&tv, sizeof(tv));
#endif
        }

        error = Error::Success;
        return true;
      });

  if (sock != INVALID_SOCKET) {
    error = Error::Success;
  } else {
    if (error == Error::Success) { error = Error::Connection; }
  }

  return sock;
}